

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IR.cpp
# Opt level: O0

void __thiscall
IR::ByteCodeUsesInstr::SetRemovedOpndSymbol
          (ByteCodeUsesInstr *this,bool isJITOptimizedReg,uint symId)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  JitArenaAllocator *pJVar4;
  BVSparse<Memory::JitArenaAllocator> *this_00;
  TrackAllocData local_40;
  uint local_18;
  undefined1 local_11;
  uint symId_local;
  bool isJITOptimizedReg_local;
  ByteCodeUsesInstr *this_local;
  
  local_18 = symId;
  local_11 = isJITOptimizedReg;
  _symId_local = this;
  if (isJITOptimizedReg) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.cpp"
                       ,0x3af,"(false)",
                       "Tried to add a jit-optimized register to a ByteCodeUses instruction!");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  else {
    if (this->byteCodeUpwardExposedUsed == (BVSparse<Memory::JitArenaAllocator> *)0x0) {
      pJVar4 = ((this->super_Instr).m_func)->m_alloc;
      Memory::TrackAllocData::CreateTrackAllocData
                (&local_40,(type_info *)&BVSparse<Memory::JitArenaAllocator>::typeinfo,0,
                 0xffffffffffffffff,
                 "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.cpp"
                 ,0x3b7);
      pJVar4 = (JitArenaAllocator *)
               Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
               TrackAllocInfo((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)
                              pJVar4,&local_40);
      this_00 = (BVSparse<Memory::JitArenaAllocator> *)
                new<Memory::JitArenaAllocator>(0x20,pJVar4,0x4e98c0);
      BVSparse<Memory::JitArenaAllocator>::BVSparse(this_00,((this->super_Instr).m_func)->m_alloc);
      this->byteCodeUpwardExposedUsed = this_00;
    }
    BVSparse<Memory::JitArenaAllocator>::Set(this->byteCodeUpwardExposedUsed,local_18);
  }
  return;
}

Assistant:

void ByteCodeUsesInstr::SetRemovedOpndSymbol(bool isJITOptimizedReg, uint symId)
{
    if (isJITOptimizedReg)
    {
        AssertMsg(false, "Tried to add a jit-optimized register to a ByteCodeUses instruction!");
        // Although we assert on debug builds, we should actually be ok with release builds
        // if we ignore the operand; not ignoring it, however, can cause us to introduce an
        // inconsistency in bytecode register lifetimes.
        return;
    }
    if(!this->byteCodeUpwardExposedUsed)
    {
        this->byteCodeUpwardExposedUsed = JitAnew(m_func->m_alloc, BVSparse<JitArenaAllocator>, m_func->m_alloc);
    }
    this->byteCodeUpwardExposedUsed->Set(symId);
}